

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qdtls.cpp
# Opt level: O1

bool __thiscall QDtls::resumeHandshake(QDtls *this,QUdpSocket *socket)

{
  long *plVar1;
  long lVar2;
  undefined1 uVar3;
  int iVar4;
  long lVar5;
  undefined8 uVar6;
  long in_FS_OFFSET;
  QArrayData *local_40 [3];
  long local_28;
  
  local_28 = *(long *)(in_FS_OFFSET + 0x28);
  plVar1 = *(long **)(*(long *)&this->field_0x8 + 0x78);
  if (plVar1 != (long *)0x0) {
    if (socket == (QUdpSocket *)0x0) {
      lVar2 = *(long *)(*plVar1 + -0x60);
      QMetaObject::tr((char *)local_40,(char *)&staticMetaObject,0x2850e2);
      lVar5 = *(long *)((long)plVar1 + lVar2);
      uVar6 = 1;
    }
    else {
      iVar4 = (**(code **)(*plVar1 + 0x90))(plVar1);
      if (iVar4 == 2) {
        if (*(long *)(in_FS_OFFSET + 0x28) == local_28) {
          uVar3 = (**(code **)(*plVar1 + 0xb8))(plVar1,socket);
          return (bool)uVar3;
        }
        goto LAB_0025b0d9;
      }
      lVar2 = *(long *)(*plVar1 + -0x60);
      QMetaObject::tr((char *)local_40,(char *)&staticMetaObject,0x28523b);
      lVar5 = *(long *)((long)plVar1 + lVar2);
      uVar6 = 2;
    }
    (**(code **)(lVar5 + 0x10))((long)plVar1 + lVar2,uVar6,local_40);
    if (local_40[0] != (QArrayData *)0x0) {
      LOCK();
      (local_40[0]->ref_)._q_value.super___atomic_base<int>._M_i =
           (local_40[0]->ref_)._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if ((local_40[0]->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(local_40[0],2,0x10);
      }
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_28) {
    return false;
  }
LAB_0025b0d9:
  __stack_chk_fail();
}

Assistant:

bool QDtls::resumeHandshake(QUdpSocket *socket)
{
    Q_D(QDtls);

    auto *backend = d->backend.get();
    if (!backend)
        return false;

    if (!socket) {
        backend->setDtlsError(QDtlsError::InvalidInputParameters, tr("Invalid (nullptr) socket"));
        return false;
    }

    if (backend->state() != PeerVerificationFailed) {
        backend->setDtlsError(QDtlsError::InvalidOperation,
                              tr("Cannot resume, not in VerificationError state"));
        return false;
    }

    return backend->resumeHandshake(socket);
}